

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<TPZFlopCounter>::AutoFill
          (TPZMatrix<TPZFlopCounter> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  TPZFlopCounter val;
  double local_78;
  double local_60;
  int local_54;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_54 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar5 = 0;
    do {
      local_78 = 0.0;
      lVar4 = 0;
      dVar2 = 0.0;
      if (lVar5 != 0 && local_54 != 0) {
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar5);
          local_60 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar4,&local_60);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar4);
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          local_78 = dVar2 + ABS((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          lVar4 = lVar4 + 1;
          dVar2 = local_78;
        } while (lVar5 != lVar4);
      }
      for (; lVar1 = (this->super_TPZBaseMatrix).fCol, lVar4 < lVar1; lVar4 = lVar4 + 1) {
        iVar3 = rand();
        TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
        local_50 = (double)iVar3 / 2147483647.0;
        if (lVar5 != lVar4) {
          local_78 = local_78 + ABS(local_50);
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        }
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar5,lVar4,&local_50);
        if (iVar3 == 0) {
          Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
        }
      }
      if ((this->super_TPZBaseMatrix).fRow == lVar1) {
        local_48 = ABS(local_78);
        uStack_40 = 0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
        if (ABS((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) < local_48) {
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          local_60 = local_78 + 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar5,&local_60);
        }
        if ((local_48 < 1e-12) &&
           ((*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5)
           , ABS((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02)) < 1e-12)) {
          local_60 = 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar5,&local_60);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}